

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O0

void soul::heart::Checker::sanityCheckAdvanceAndStreamCalls(Program *program)

{
  bool bVar1;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this;
  Module *pMVar2;
  pool_ref<soul::heart::Function> *ppVar3;
  Function *pFVar4;
  AdvanceClock *pAVar5;
  Statement *pSVar6;
  CompileMessage local_150;
  pool_ptr<soul::heart::Statement> local_118;
  pool_ptr<soul::heart::Statement> rw;
  function<void_(soul::heart::FunctionCall_&)> local_108;
  CompileMessage local_e8;
  CompileMessage local_b0;
  pool_ptr<soul::heart::AdvanceClock> local_68;
  pool_ptr<soul::heart::AdvanceClock> firstAdvanceCall;
  pool_ref<soul::heart::Function> *f;
  pool_ref<soul::heart::Function> *__end3;
  pool_ref<soul::heart::Function> *__begin3;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *local_38;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *__range3;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  Program *program_local;
  
  this = Program::getModules(program);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(this);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar1) {
      return;
    }
    __range3 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
               ::operator*(&__end2);
    pMVar2 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range3);
    ___begin3 = Module::Functions::get(&pMVar2->functions);
    local_38 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::heart::Function>_>::begin(local_38);
    ppVar3 = ArrayView<soul::pool_ref<soul::heart::Function>_>::end(local_38);
    for (; __end3 != ppVar3; __end3 = __end3 + 1) {
      firstAdvanceCall.object = (AdvanceClock *)__end3;
      pFVar4 = pool_ref::operator_cast_to_Function_((pool_ref *)__end3);
      Utilities::findFirstAdvanceCall((Utilities *)&local_68,pFVar4);
      pFVar4 = pool_ref<soul::heart::Function>::operator->
                         ((pool_ref<soul::heart::Function> *)firstAdvanceCall.object);
      bVar1 = FunctionType::isRun(&pFVar4->functionType);
      if ((bVar1) &&
         (bVar1 = pool_ptr<soul::heart::AdvanceClock>::operator==(&local_68,(void *)0x0), bVar1)) {
        pFVar4 = pool_ref<soul::heart::Function>::operator->
                           ((pool_ref<soul::heart::Function> *)firstAdvanceCall.object);
        Errors::runFunctionMustCallAdvance<>();
        CodeLocation::throwError(&(pFVar4->super_Object).location,&local_b0);
      }
      bVar1 = pool_ptr<soul::heart::AdvanceClock>::operator!=(&local_68,(void *)0x0);
      if (bVar1) {
        pMVar2 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range3);
        bVar1 = Module::isProcessor(pMVar2);
        if (!bVar1) {
          pAVar5 = pool_ptr<soul::heart::AdvanceClock>::operator->(&local_68);
          Errors::advanceCannotBeCalledHere<>();
          CodeLocation::throwError(&(pAVar5->super_Statement).super_Object.location,&local_e8);
        }
      }
      pFVar4 = pool_ref<soul::heart::Function>::operator->
                         ((pool_ref<soul::heart::Function> *)firstAdvanceCall.object);
      bVar1 = FunctionType::isSystemInit(&pFVar4->functionType);
      if (!bVar1) {
        pFVar4 = pool_ref<soul::heart::Function>::operator->
                           ((pool_ref<soul::heart::Function> *)firstAdvanceCall.object);
        std::function<void(soul::heart::FunctionCall&)>::
        function<soul::heart::Checker::sanityCheckAdvanceAndStreamCalls(soul::Program_const&)::_lambda(soul::heart::FunctionCall&)_1_,void>
                  ((function<void(soul::heart::FunctionCall&)> *)&local_108,
                   (anon_class_1_0_00000001 *)((long)&rw.object + 7));
        Function::visitStatements<soul::heart::FunctionCall>(pFVar4,&local_108);
        std::function<void_(soul::heart::FunctionCall_&)>::~function(&local_108);
      }
      pFVar4 = pool_ref<soul::heart::Function>::operator->
                         ((pool_ref<soul::heart::Function> *)firstAdvanceCall.object);
      bVar1 = FunctionType::isUserInit(&pFVar4->functionType);
      if (bVar1) {
        pFVar4 = pool_ref::operator_cast_to_Function_((pool_ref *)firstAdvanceCall.object);
        Utilities::findFirstStreamAccess((Utilities *)&local_118,pFVar4);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_118);
        if (bVar1) {
          pSVar6 = pool_ptr<soul::heart::Statement>::operator->(&local_118);
          Errors::streamsCannotBeUsedDuringInit<>();
          CodeLocation::throwError(&(pSVar6->super_Object).location,&local_150);
        }
        pool_ptr<soul::heart::Statement>::~pool_ptr(&local_118);
      }
      pool_ptr<soul::heart::AdvanceClock>::~pool_ptr(&local_68);
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static void sanityCheckAdvanceAndStreamCalls (const Program& program)
    {
        for (auto& m : program.getModules())
        {
            for (auto& f : m->functions.get())
            {
                auto firstAdvanceCall = heart::Utilities::findFirstAdvanceCall (f);

                if (f->functionType.isRun() && firstAdvanceCall == nullptr)
                    f->location.throwError (Errors::runFunctionMustCallAdvance());

                if (firstAdvanceCall != nullptr && ! m->isProcessor())
                    firstAdvanceCall->location.throwError (Errors::advanceCannotBeCalledHere());

                if (! f->functionType.isSystemInit())
                {
                    f->visitStatements<heart::FunctionCall> ([] (heart::FunctionCall& call)
                    {
                        auto& target = *call.function;

                        if (target.functionType.isRun() || target.functionType.isUserInit() || target.functionType.isEvent())
                            target.location.throwError (Errors::cannotCallFunction (target.getReadableName()));
                    });
                }

                if (f->functionType.isUserInit())
                    if (auto rw = heart::Utilities::findFirstStreamAccess (f))
                        rw->location.throwError (Errors::streamsCannotBeUsedDuringInit());
            }
        }
    }